

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O1

shared_ptr<kratos::EventTracingStmt> __thiscall
kratos::Event::fire(Event *this,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                   *fields)

{
  _Rb_tree_node_base *p_Var1;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined1 auVar2 [16];
  shared_ptr<kratos::EventTracingStmt> sVar3;
  undefined1 local_31;
  
  (this->event_name_)._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::EventTracingStmt,std::allocator<kratos::EventTracingStmt>,std::__cxx11::string&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->event_name_)._M_string_length,
             (EventTracingStmt **)this,(allocator<kratos::EventTracingStmt> *)&local_31,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fields);
  std::__shared_ptr<kratos::EventTracingStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::EventTracingStmt,kratos::EventTracingStmt>
            ((__shared_ptr<kratos::EventTracingStmt,(__gnu_cxx::_Lock_policy)2> *)this,
             (EventTracingStmt *)(this->event_name_)._M_dataplus._M_p);
  auVar2._8_8_ = extraout_RDX;
  auVar2._0_8_ = *(undefined8 *)(in_RDX + 0x18);
  while( true ) {
    p_Var1 = auVar2._0_8_;
    if (p_Var1 == (_Rb_tree_node_base *)(in_RDX + 8)) break;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Var>const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)((this->event_name_)._M_dataplus._M_p + 0xe8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1),
               (shared_ptr<kratos::Var> *)(p_Var1 + 2));
    auVar2 = std::_Rb_tree_increment(p_Var1);
  }
  sVar3.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       auVar2._8_8_;
  sVar3.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::EventTracingStmt>)
         sVar3.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<EventTracingStmt> Event::fire(
    const std::map<std::string, std::shared_ptr<Var>> &fields) {
    auto stmt = std::make_shared<EventTracingStmt>(event_name_);
    for (auto const &[name, value] : fields) {
        stmt->add_event_field(name, value);
    }
    return stmt;
}